

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSLUtils.hpp
# Opt level: O0

void Diligent::HandleHLSLCompilerResult<IDxcBlob>
               (bool CompilationSucceeded,IDxcBlob *pCompilerMsgBlob,string *ShaderSource,
               char *ShaderName,IDataBlob **ppOutputLog)

{
  undefined *puVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DataBlobImpl *pDVar3;
  void *__src;
  ostream *poVar4;
  undefined8 uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char *pcVar6;
  char *local_2b8;
  ulong local_288;
  char *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  Diligent local_258 [32];
  undefined1 local_238 [8];
  string _msg;
  string local_210 [32];
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [392];
  char *local_58;
  char *log;
  RefCntAutoPtr<Diligent::DataBlobImpl> pOutputLogBlob;
  size_t ShaderSourceLen;
  size_t CompilerMsgLen;
  char *CompilerMsg;
  IDataBlob **ppOutputLog_local;
  char *ShaderName_local;
  string *ShaderSource_local;
  IDxcBlob *pCompilerMsgBlob_local;
  bool CompilationSucceeded_local;
  
  if (pCompilerMsgBlob == (IDxcBlob *)0x0) {
    local_280 = (char *)0x0;
  }
  else {
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[3])();
    local_280 = (char *)CONCAT44(extraout_var,iVar2);
  }
  if (local_280 == (char *)0x0) {
    local_288 = 0;
  }
  else {
    iVar2 = (*(pCompilerMsgBlob->super_IUnknown)._vptr_IUnknown[4])();
    local_288 = CONCAT44(extraout_var_00,iVar2);
  }
  if (ppOutputLog != (IDataBlob **)0x0) {
    pOutputLogBlob.m_pObject = (DataBlobImpl *)std::__cxx11::string::length();
    DataBlobImpl::Create
              ((DataBlobImpl *)&log,
               (long)&((pOutputLogBlob.m_pObject)->super_ObjectBase<Diligent::IDataBlob>).
                      super_RefCountedObject<Diligent::IDataBlob>.super_IDataBlob.super_IObject.
                      _vptr_IObject + local_288 + 2,(void *)0x0);
    pDVar3 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&log);
    local_58 = DataBlobImpl::GetDataPtr<char>(pDVar3,0);
    if (local_280 != (char *)0x0) {
      memcpy(local_58,local_280,local_288);
    }
    local_58[local_288] = '\0';
    pcVar6 = local_58 + local_288 + 1;
    local_58 = pcVar6;
    __src = (void *)std::__cxx11::string::data();
    memcpy(pcVar6,__src,(size_t)pOutputLogBlob.m_pObject);
    local_58[(long)pOutputLogBlob.m_pObject] = '\0';
    pDVar3 = RefCntAutoPtr<Diligent::DataBlobImpl>::operator->
                       ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&log);
    DataBlobImpl::QueryInterface(pDVar3,(INTERFACE_ID *)IID_DataBlob,(IObject **)ppOutputLog);
    RefCntAutoPtr<Diligent::DataBlobImpl>::~RefCntAutoPtr
              ((RefCntAutoPtr<Diligent::DataBlobImpl> *)&log);
  }
  if ((!CompilationSucceeded) || (local_288 != 0)) {
    std::__cxx11::stringstream::stringstream(local_1f0);
    pcVar6 = "Failed to compile shader \'";
    if (CompilationSucceeded) {
      pcVar6 = "Compiler output for shader \'";
    }
    poVar4 = std::operator<<(local_1e0,pcVar6);
    local_2b8 = ShaderName;
    if (ShaderName == (char *)0x0) {
      local_2b8 = "<unknown>";
    }
    poVar4 = std::operator<<(poVar4,local_2b8);
    std::operator<<(poVar4,"\'");
    if ((local_280 == (char *)0x0) || (local_288 == 0)) {
      if (!CompilationSucceeded) {
        std::operator<<(local_1e0," (no shader log available).");
      }
    }
    else {
      poVar4 = std::operator<<(local_1e0,":");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_210,local_280,local_288,(allocator *)(_msg.field_2._M_local_buf + 0xf));
      std::operator<<(poVar4,local_210);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)(_msg.field_2._M_local_buf + 0xf));
    }
    if (CompilationSucceeded) {
      std::__cxx11::stringstream::str();
      FormatString<std::__cxx11::string>((string *)local_238,local_258,Args);
      std::__cxx11::string::~string((string *)local_258);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar5 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(0,uVar5,0);
      }
      std::__cxx11::string::~string((string *)local_238);
    }
    else {
      std::__cxx11::stringstream::str();
      LogError<true,std::__cxx11::string>
                (false,"HandleHLSLCompilerResult",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/include/HLSLUtils.hpp"
                 ,0x60,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
    }
    std::__cxx11::stringstream::~stringstream(local_1f0);
  }
  return;
}

Assistant:

void HandleHLSLCompilerResult(bool               CompilationSucceeded,
                              BlobType*          pCompilerMsgBlob,
                              const std::string& ShaderSource,
                              const char*        ShaderName,
                              IDataBlob**        ppOutputLog) noexcept(false)
{
    const char*  CompilerMsg    = pCompilerMsgBlob ? static_cast<const char*>(pCompilerMsgBlob->GetBufferPointer()) : nullptr;
    const size_t CompilerMsgLen = CompilerMsg ? pCompilerMsgBlob->GetBufferSize() : 0;

    if (ppOutputLog != nullptr)
    {
        const size_t                ShaderSourceLen = ShaderSource.length();
        RefCntAutoPtr<DataBlobImpl> pOutputLogBlob  = DataBlobImpl::Create(ShaderSourceLen + 1 + CompilerMsgLen + 1);

        char* log = pOutputLogBlob->GetDataPtr<char>();

        if (CompilerMsg != nullptr)
            memcpy(log, CompilerMsg, CompilerMsgLen);
        log[CompilerMsgLen] = 0; // Explicitly set null terminator
        log += CompilerMsgLen + 1;

        memcpy(log, ShaderSource.data(), ShaderSourceLen);
        log[ShaderSourceLen] = 0;

        pOutputLogBlob->QueryInterface(IID_DataBlob, reinterpret_cast<IObject**>(ppOutputLog));
    }

    if (!CompilationSucceeded || CompilerMsgLen != 0)
    {
        std::stringstream ss;
        ss << (CompilationSucceeded ? "Compiler output for shader '" : "Failed to compile shader '")
           << (ShaderName != nullptr ? ShaderName : "<unknown>")
           << "'";
        if (CompilerMsg != nullptr && CompilerMsgLen != 0)
        {
            ss << ":" << std::endl
               << std::string{CompilerMsg, CompilerMsgLen};
        }
        else if (!CompilationSucceeded)
        {
            ss << " (no shader log available).";
        }

        if (CompilationSucceeded)
        {
            LOG_INFO_MESSAGE(ss.str());
        }
        else
        {
            LOG_ERROR_AND_THROW(ss.str());
        }
    }
}